

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

string * __thiscall
libcellml::XmlNode::convertToString_abi_cxx11_(string *__return_storage_ptr__,XmlNode *this)

{
  xmlNodePtr pxVar1;
  char *__s;
  allocator<char> local_22;
  undefined1 local_21;
  undefined8 *local_20;
  xmlBufferPtr buffer;
  XmlNode *this_local;
  string *contentString;
  
  buffer = (xmlBufferPtr)this;
  this_local = (XmlNode *)__return_storage_ptr__;
  xmlKeepBlanksDefault(1);
  local_20 = (undefined8 *)xmlBufferCreate();
  pxVar1 = this->mPimpl->mXmlNodePtr;
  xmlNodeDump(local_20,pxVar1->doc,pxVar1,0);
  local_21 = 0;
  __s = (char *)*local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  xmlBufferFree(local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::convertToString() const
{
    xmlKeepBlanksDefault(1);
    xmlBufferPtr buffer = xmlBufferCreate();
    xmlNodeDump(buffer, mPimpl->mXmlNodePtr->doc, mPimpl->mXmlNodePtr, 0, 0);
    std::string contentString = std::string(reinterpret_cast<const char *>(buffer->content));
    xmlBufferFree(buffer);
    return contentString;
}